

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::clearList(Graph *this)

{
  long lVar1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0x4b0; lVar2 = lVar2 + 0x18) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               ((long)&this->adj_list[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar2),1);
    lVar1 = *(long *)((long)&this->adj_list[0].super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar2);
    if (*(long *)((long)&this->adj_list[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + lVar2) != lVar1) {
      *(long *)((long)&this->adj_list[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + lVar2) = lVar1;
    }
  }
  return;
}

Assistant:

void Graph::clearList(){ //resets list to be empty
   for(auto &vec : this->adj_list){
      vec.resize(1);
      vec.clear();
   }
   return void();
}